

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  pointer pPVar1;
  int iVar2;
  pointer pPVar3;
  double local_a8;
  double suiteTime_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  ScopedElement local_60;
  ScopedElement e;
  ScopedElement scoped;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_a8 = suiteTime;
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"testsuite","");
  this_00 = &this->xml;
  local_60.m_writer = this_00;
  XmlWriter::startElement(this_00,(string *)&scoped);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"name","");
  XmlWriter::writeAttribute(this_00,(string *)&scoped,&(groupNode->value).groupInfo.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"errors","");
  XmlWriter::writeAttribute<unsigned_int>(this_00,(string *)&scoped,&this->unexpectedExceptions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"failures","");
  local_80._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,(string *)&scoped,(unsigned_long *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"tests","");
  local_80._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                 (groupNode->value).totals.assertions.passed +
                (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,(string *)&scoped,(unsigned_long *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"hostname","");
  XmlWriter::writeAttribute<char[4]>(this_00,(string *)&scoped,(char (*) [4])"tbd");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  iVar2 = (*(((this->super_CumulativeReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar2 == 2) {
    scoped.m_writer = (XmlWriter *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"time","");
    XmlWriter::writeAttribute<char[1]>(this_00,(string *)&scoped,(char (*) [1])0x157bd6);
  }
  else {
    scoped.m_writer = (XmlWriter *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"time","");
    XmlWriter::writeAttribute<double>(this_00,(string *)&scoped,&local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"timestamp","");
  XmlWriter::writeAttribute<char[4]>(this_00,(string *)&scoped,(char (*) [4])"tbd");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  pPVar1 = (groupNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (groupNode->children).
                super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    writeTestCase(this,pPVar3->m_p);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"system-out","");
  e.m_writer = this_00;
  XmlWriter::startElement(this_00,(string *)&scoped);
  std::__cxx11::stringbuf::str();
  trim(&local_80,(string *)&suiteTime_local);
  XmlWriter::writeText(e.m_writer,&local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suiteTime_local != &local_90) {
    operator_delete((void *)suiteTime_local,local_90._M_allocated_capacity + 1);
  }
  XmlWriter::ScopedElement::~ScopedElement(&e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  scoped.m_writer = (XmlWriter *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&scoped,"system-err","");
  e.m_writer = this_00;
  XmlWriter::startElement(this_00,(string *)&scoped);
  std::__cxx11::stringbuf::str();
  trim(&local_80,(string *)&suiteTime_local);
  XmlWriter::writeText(e.m_writer,&local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suiteTime_local != &local_90) {
    operator_delete((void *)suiteTime_local,local_90._M_allocated_capacity + 1);
  }
  XmlWriter::ScopedElement::~ScopedElement(&e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scoped.m_writer != &local_40) {
    operator_delete(scoped.m_writer,local_40._M_allocated_capacity + 1);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_60);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }